

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O1

bool cmAddLibraryCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  string *name;
  pointer input;
  bool bVar3;
  bool globallyVisible;
  int iVar4;
  PolicyStatus PVar5;
  cmValue cVar6;
  undefined8 uVar7;
  undefined7 extraout_var;
  long lVar8;
  cmState *this;
  cmTarget *pcVar9;
  string *psVar10;
  byte bVar11;
  uint uVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  int iVar13;
  TargetType TVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  undefined1 local_108 [48];
  uint local_d8;
  uint local_d4;
  undefined1 local_d0 [32];
  char local_b0 [8];
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  uint local_8c;
  cmMakefile *local_88;
  uint local_80;
  uint local_7c;
  pointer local_78;
  string local_70;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_70.field_2._M_allocated_capacity = local_d0._16_8_;
    local_50._M_dataplus._M_p = (pointer)local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) {
      return false;
    }
    goto LAB_0032d67e;
  }
  pcVar1 = status->Makefile;
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"BUILD_SHARED_LIBS","");
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_d0);
  local_88 = pcVar1;
  if (cVar6.Value == (string *)0x0) {
    TVar14 = STATIC_LIBRARY;
  }
  else {
    value._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar6.Value)->_M_string_length;
    bVar3 = cmValue::IsOff(value);
    TVar14 = SHARED_LIBRARY - bVar3;
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  local_78 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __first._M_current = local_78 + 1;
  psVar10 = &status->Error;
  local_8c = 0;
  local_d8 = 0;
  local_d4 = 0;
  local_7c = 0;
  local_80 = 0;
  do {
    if (__first._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_0032d5f4;
    local_d0._0_8_ = local_d0 + 0x10;
    pcVar2 = ((__first._M_current)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar2,pcVar2 + (__first._M_current)->_M_string_length);
    uVar7 = std::__cxx11::string::compare((char *)local_d0);
    if ((int)uVar7 == 0) {
      if (TVar14 != INTERFACE_LIBRARY) {
        TVar14 = STATIC_LIBRARY;
LAB_0032d4cc:
        __first._M_current = __first._M_current + 1;
        iVar13 = 0;
        local_d4 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
        goto LAB_0032d4d5;
      }
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"INTERFACE library specified with conflicting STATIC type.","")
      ;
      std::__cxx11::string::_M_assign((string *)psVar10);
LAB_0032d499:
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      TVar14 = INTERFACE_LIBRARY;
LAB_0032d4ba:
      iVar13 = 1;
    }
    else {
      uVar7 = std::__cxx11::string::compare((char *)local_d0);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = SHARED_LIBRARY;
          goto LAB_0032d4cc;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"INTERFACE library specified with conflicting SHARED type.",
                   "");
        std::__cxx11::string::_M_assign((string *)psVar10);
        goto LAB_0032d499;
      }
      uVar7 = std::__cxx11::string::compare((char *)local_d0);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = MODULE_LIBRARY;
          goto LAB_0032d4cc;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"INTERFACE library specified with conflicting MODULE type.",
                   "");
        std::__cxx11::string::_M_assign((string *)psVar10);
        goto LAB_0032d499;
      }
      uVar7 = std::__cxx11::string::compare((char *)local_d0);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = OBJECT_LIBRARY;
          goto LAB_0032d4cc;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"INTERFACE library specified with conflicting OBJECT type.",
                   "");
        std::__cxx11::string::_M_assign((string *)psVar10);
        goto LAB_0032d499;
      }
      uVar7 = std::__cxx11::string::compare((char *)local_d0);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = UNKNOWN_LIBRARY;
          goto LAB_0032d4cc;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"INTERFACE library specified with conflicting UNKNOWN type.",
                   "");
        std::__cxx11::string::_M_assign((string *)psVar10);
        goto LAB_0032d499;
      }
      uVar7 = std::__cxx11::string::compare((char *)local_d0);
      if ((int)uVar7 != 0) {
        uVar7 = std::__cxx11::string::compare((char *)local_d0);
        if ((int)uVar7 != 0) {
          uVar7 = std::__cxx11::string::compare((char *)__first._M_current);
          if ((int)uVar7 == 0) {
            __first._M_current = __first._M_current + 1;
            local_80 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
            iVar13 = 0;
          }
          else {
            uVar7 = std::__cxx11::string::compare((char *)__first._M_current);
            if ((int)uVar7 == 0) {
              __first._M_current = __first._M_current + 1;
              iVar13 = 0;
              local_d8 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
            else if (((local_d8 & 1) == 0) ||
                    (uVar7 = std::__cxx11::string::compare((char *)__first._M_current),
                    (int)uVar7 != 0)) {
              iVar13 = 3;
              if ((TVar14 == INTERFACE_LIBRARY) &&
                 (iVar4 = std::__cxx11::string::compare((char *)__first._M_current), iVar4 == 0)) {
                local_108._0_8_ = local_108 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_108,
                           "GLOBAL option may only be used with IMPORTED libraries.","");
                std::__cxx11::string::_M_assign((string *)psVar10);
                goto LAB_0032d499;
              }
            }
            else {
              __first._M_current = __first._M_current + 1;
              iVar13 = 0;
              local_8c = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
          }
          goto LAB_0032d4d5;
        }
        if ((local_d4 & 1) == 0) {
          if ((local_7c & 1) == 0) {
            TVar14 = INTERFACE_LIBRARY;
            goto LAB_0032d4cc;
          }
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"INTERFACE library specified with conflicting ALIAS type.",
                     "");
          std::__cxx11::string::_M_assign((string *)psVar10);
        }
        else {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,
                     "INTERFACE library specified with conflicting/multiple types.","");
          std::__cxx11::string::_M_assign((string *)psVar10);
        }
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        goto LAB_0032d4ba;
      }
      if (TVar14 == INTERFACE_LIBRARY) {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"INTERFACE library specified with conflicting ALIAS type.",""
                  );
        std::__cxx11::string::_M_assign((string *)psVar10);
        goto LAB_0032d499;
      }
      __first._M_current = __first._M_current + 1;
      iVar13 = 0;
      local_7c = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
LAB_0032d4d5:
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
  } while (iVar13 == 0);
  if (iVar13 != 3) {
    return false;
  }
LAB_0032d5f4:
  input = local_78;
  uVar12 = local_8c;
  if (((local_d8 & 1) != 0) && ((local_8c & 1) == 0)) {
    bVar3 = cmMakefile::IsImportedTargetGlobalScope(local_88);
    uVar12 = (uint)CONCAT71(extraout_var,bVar3);
  }
  if (((TVar14 == INTERFACE_LIBRARY) && ((local_d8 & 1) == 0)) && ((uVar12 & 1) != 0)) {
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"INTERFACE library specified as GLOBAL, but not as IMPORTED.","");
    std::__cxx11::string::_M_assign((string *)psVar10);
  }
  else {
    bVar3 = cmGeneratorExpression::IsValidTargetName(input);
    if (bVar3) {
      bVar3 = cmGlobalGenerator::IsReservedTarget(input);
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
    if ((((~bVar3 | (byte)local_d8) & 1) == 0) && ((local_7c & 1) == 0)) {
      lVar8 = std::__cxx11::string::find((char)input,0x3a);
      bVar3 = lVar8 == -1;
    }
    if ((bVar3 == false) && (bVar3 = cmMakefile::CheckCMP0037(local_88,input,TVar14), !bVar3)) {
      return false;
    }
    if ((local_7c & 1) == 0) {
      if (((local_d8 & 1) == 0) || ((local_80 & 1) == 0)) {
        local_8c = uVar12;
        if ((TVar14 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
          this = cmMakefile::GetState(local_88);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"TARGET_SUPPORTS_SHARED_LIBS","");
          bVar3 = cmState::GetGlobalPropertyAsBool(this,&local_70);
          name = local_78;
          bVar3 = !bVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar3 = false;
          name = local_78;
        }
        if (bVar3) {
          local_d0._24_8_ = "MODULE";
          if (TVar14 == SHARED_LIBRARY) {
            local_d0._24_8_ = "SHARED";
          }
          local_d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x18;
          local_d0._8_8_ = "ADD_LIBRARY called with ";
          local_d0._16_8_ = 6;
          local_b0[0] = 'B';
          local_b0[1] = '\0';
          local_b0[2] = '\0';
          local_b0[3] = '\0';
          local_b0[4] = '\0';
          local_b0[5] = '\0';
          local_b0[6] = '\0';
          local_b0[7] = '\0';
          local_a8 = " option but the target platform does not support dynamic linking. ";
          local_a0 = 0x3d;
          local_98 = "Building a STATIC library instead. This may lead to problems.";
          views._M_len = 4;
          views._M_array = (iterator)local_d0;
          cmCatViews_abi_cxx11_((string *)local_108,views);
          cmMakefile::IssueMessage(local_88,AUTHOR_WARNING,(string *)local_108);
          bVar11 = (byte)local_8c;
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          TVar14 = STATIC_LIBRARY;
        }
        else {
          bVar11 = (byte)local_8c;
        }
        if ((local_d8 & 1) == 0) {
          if (TVar14 == UNKNOWN_LIBRARY) {
            local_d0._0_8_ = local_d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,
                       "The UNKNOWN library type may be used only for IMPORTED libraries.","");
            cmMakefile::IssueMessage(local_88,FATAL_ERROR,(string *)local_d0);
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
            }
            return true;
          }
          local_d0._0_8_ = local_d0 + 0x10;
          local_d0._8_8_ = (pointer)0x0;
          local_d0._16_8_ = local_d0._16_8_ & 0xffffffffffffff00;
          bVar3 = cmMakefile::EnforceUniqueName(local_88,name,(string *)local_d0,false);
          if (bVar3) {
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar10);
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
            }
            if (!bVar3) {
              return false;
            }
          }
          if ((TVar14 != INTERFACE_LIBRARY) ||
             ((bVar3 = cmGeneratorExpression::IsValidTargetName(name), bVar3 &&
              (lVar8 = std::__cxx11::string::find((char *)name,0x752237,0), lVar8 == -1)))) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_d0
                       ,__first,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish,
                       (allocator_type *)local_108);
            cmMakefile::AddLibrary
                      (local_88,name,TVar14,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d0,(bool)((byte)local_80 & 1));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d0);
            return true;
          }
          local_d0._24_8_ = (name->_M_dataplus)._M_p;
          local_d0._16_8_ = name->_M_string_length;
          local_d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2b;
          local_d0._8_8_ = "Invalid name for INTERFACE library target: ";
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_d0;
          cmCatViews_abi_cxx11_((string *)local_108,views_00);
          std::__cxx11::string::_M_assign((string *)psVar10);
        }
        else {
          if ((local_d4 & 1) == 0) {
            local_d0._0_8_ = local_d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,"called with IMPORTED argument but no library type.","");
            std::__cxx11::string::_M_assign((string *)psVar10);
            goto LAB_0032d66a;
          }
          if ((TVar14 != INTERFACE_LIBRARY) ||
             (bVar3 = cmGeneratorExpression::IsValidTargetName(name), bVar3)) {
            pcVar1 = local_88;
            pcVar9 = cmMakefile::FindTargetToUse(local_88,name,false);
            if (pcVar9 == (cmTarget *)0x0) {
              cmMakefile::AddImportedTarget(pcVar1,name,TVar14,(bool)(bVar11 & 1));
              return true;
            }
            local_d0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1f;
            local_d0._8_8_ = "cannot create imported target \"";
            local_108._8_8_ = (name->_M_dataplus)._M_p;
            local_108._0_8_ = name->_M_string_length;
            cmStrCat<char[60]>(&local_50,(cmAlphaNum *)local_d0,(cmAlphaNum *)local_108,
                               (char (*) [60])
                               "\" because another target with the same name already exists.");
            std::__cxx11::string::_M_assign((string *)psVar10);
            local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return false;
            }
            goto LAB_0032d67e;
          }
          local_d0._24_8_ = (name->_M_dataplus)._M_p;
          local_d0._16_8_ = name->_M_string_length;
          local_d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x34;
          local_d0._8_8_ = "Invalid name for IMPORTED INTERFACE library target: ";
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_d0;
          cmCatViews_abi_cxx11_((string *)local_108,views_01);
          std::__cxx11::string::_M_assign((string *)psVar10);
        }
        local_70.field_2._M_allocated_capacity = local_108._16_8_;
        local_50._M_dataplus._M_p = (pointer)local_108._0_8_;
        if ((undefined1 *)local_108._0_8_ == local_108 + 0x10) {
          return false;
        }
        goto LAB_0032d67e;
      }
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,"excludeFromAll with IMPORTED target makes no sense.","");
      std::__cxx11::string::_M_assign((string *)psVar10);
    }
    else {
      bVar3 = cmGeneratorExpression::IsValidTargetName(input);
      pcVar1 = local_88;
      if (bVar3) {
        if ((local_80 & 1) == 0) {
          if (((local_d8 & 1) == 0) && ((uVar12 & 1) == 0)) {
            if ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start == 0x60) {
              PVar5 = cmMakefile::GetPolicyStatus(local_88,CMP0107,false);
              if ((PVar5 == NEW) &&
                 (pcVar9 = cmMakefile::FindTargetToUse(pcVar1,input,false),
                 pcVar9 != (cmTarget *)0x0)) {
                local_d0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x1c;
                local_d0._8_8_ = "cannot create ALIAS target \"";
                local_108._8_8_ = (input->_M_dataplus)._M_p;
                local_108._0_8_ = input->_M_string_length;
                cmStrCat<char[60]>(&local_70,(cmAlphaNum *)local_d0,(cmAlphaNum *)local_108,
                                   (char (*) [60])
                                   "\" because another target with the same name already exists.");
                std::__cxx11::string::_M_assign((string *)psVar10);
              }
              else {
                bVar3 = cmMakefile::IsAlias(pcVar1,__first._M_current);
                if (bVar3) {
                  local_d0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1c;
                  local_d0._8_8_ = "cannot create ALIAS target \"";
                  local_108._8_8_ = (input->_M_dataplus)._M_p;
                  local_108._0_8_ = input->_M_string_length;
                  cmStrCat<char[19],std::__cxx11::string,char[22]>
                            (&local_70,(cmAlphaNum *)local_d0,(cmAlphaNum *)local_108,
                             (char (*) [19])"\" because target \"",__first._M_current,
                             (char (*) [22])"\" is itself an ALIAS.");
                  std::__cxx11::string::_M_assign((string *)psVar10);
                }
                else {
                  pcVar9 = cmMakefile::FindTargetToUse(pcVar1,__first._M_current,true);
                  if (pcVar9 == (cmTarget *)0x0) {
                    local_d0._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1c;
                    local_d0._8_8_ = "cannot create ALIAS target \"";
                    local_108._8_8_ = (local_78->_M_dataplus)._M_p;
                    local_108._0_8_ = local_78->_M_string_length;
                    cmStrCat<char[19],std::__cxx11::string,char[26]>
                              (&local_70,(cmAlphaNum *)local_d0,(cmAlphaNum *)local_108,
                               (char (*) [19])"\" because target \"",__first._M_current,
                               (char (*) [26])"\" does not already exist.");
                    std::__cxx11::string::_M_assign((string *)psVar10);
                  }
                  else {
                    TVar14 = cmTarget::GetType(pcVar9);
                    if (((TVar14 - STATIC_LIBRARY < 4) || (TVar14 == INTERFACE_LIBRARY)) ||
                       ((TVar14 == UNKNOWN_LIBRARY && (bVar3 = cmTarget::IsImported(pcVar9), bVar3))
                       )) {
                      bVar3 = cmTarget::IsImported(pcVar9);
                      globallyVisible = true;
                      if (bVar3) {
                        globallyVisible = cmTarget::IsImportedGloballyVisible(pcVar9);
                      }
                      cmMakefile::AddAlias(pcVar1,local_78,__first._M_current,globallyVisible);
                      return true;
                    }
                    local_d0._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1c;
                    local_d0._8_8_ = "cannot create ALIAS target \"";
                    local_108._8_8_ = (local_78->_M_dataplus)._M_p;
                    local_108._0_8_ = local_78->_M_string_length;
                    cmStrCat<char[19],std::__cxx11::string,char[20]>
                              (&local_70,(cmAlphaNum *)local_d0,(cmAlphaNum *)local_108,
                               (char (*) [19])"\" because target \"",__first._M_current,
                               (char (*) [20])"\" is not a library.");
                    std::__cxx11::string::_M_assign((string *)psVar10);
                  }
                }
              }
              local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p == &local_70.field_2) {
                return false;
              }
              goto LAB_0032d67e;
            }
            local_d0._0_8_ = local_d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,"ALIAS requires exactly one target argument.","");
            std::__cxx11::string::_M_assign((string *)psVar10);
          }
          else {
            local_d0._0_8_ = local_d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,"IMPORTED with ALIAS is not allowed.","");
            std::__cxx11::string::_M_assign((string *)psVar10);
          }
        }
        else {
          local_d0._0_8_ = local_d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
          std::__cxx11::string::_M_assign((string *)psVar10);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,"Invalid name for ALIAS: ",input);
        std::__cxx11::string::_M_assign((string *)psVar10);
      }
    }
  }
LAB_0032d66a:
  local_70.field_2._M_allocated_capacity = local_d0._16_8_;
  local_50._M_dataplus._M_p = (pointer)local_d0._0_8_;
  if ((undefined1 *)local_d0._0_8_ == local_d0 + 0x10) {
    return false;
  }
LAB_0032d67e:
  operator_delete(local_50._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmAddLibraryCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmIsOff(mf.GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  auto s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting STATIC type.");
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting SHARED type.");
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting MODULE type.");
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting OBJECT type.");
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting UNKNOWN type.");
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        status.SetError(
          "INTERFACE library specified with conflicting/multiple types.");
        return false;
      }
      if (isAlias) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      status.SetError(
        "GLOBAL option may only be used with IMPORTED libraries.");
      return false;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (importGlobal && !importTarget) {
      status.SetError(
        "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      status.SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    if (mf.GetPolicyStatus(cmPolicies::CMP0107) == cmPolicies::NEW) {
      // Make sure the target does not already exist.
      if (mf.FindTargetToUse(libName)) {
        status.SetError(cmStrCat(
          "cannot create ALIAS target \"", libName,
          "\" because another target with the same name already exists."));
        return false;
      }
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is not a library."));
      return false;
    }
    mf.AddAlias(libName, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  if (importTarget && excludeFromAll) {
    status.SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !mf.GetState()->GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS")) {
    mf.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        "ADD_LIBRARY called with ",
        (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE"),
        " option but the target platform does not support dynamic linking. ",
        "Building a STATIC library instead. This may lead to problems."));
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      status.SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        status.SetError(cmStrCat(
          "Invalid name for IMPORTED INTERFACE library target: ", libName));
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(libName)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", libName,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(libName, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      status.SetError(
        cmStrCat("Invalid name for INTERFACE library target: ", libName));
      return false;
    }
  }

  std::vector<std::string> srcs(s, args.end());
  mf.AddLibrary(libName, type, srcs, excludeFromAll);

  return true;
}